

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

strong_ordering
QCborValueConstRef::compareThreeWay_helper(QCborValueConstRef lhs,QCborValueConstRef rhs)

{
  long lVar1;
  strong_ordering sVar2;
  QList<QtCbor::Element> *in_RDX;
  long in_FS_OFFSET;
  int c;
  Element e2;
  Element e1;
  Comparison in_stack_000000f4;
  Element *in_stack_000000f8;
  QCborContainerPrivate *in_stack_00000100;
  Element *in_stack_00000108;
  QCborContainerPrivate *in_stack_00000110;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QtCbor::Element>::at(in_RDX,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  QList<QtCbor::Element>::at(in_RDX,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  compareElementRecursive
            (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
             in_stack_000000f4);
  sVar2 = Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffa8,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (strong_ordering)sVar2.m_order;
  }
  __stack_chk_fail();
}

Assistant:

Qt::strong_ordering
QCborValueConstRef::compareThreeWay_helper(QCborValueConstRef lhs, QCborValueConstRef rhs) noexcept
{
    QtCbor::Element e1 = lhs.d->elements.at(lhs.i);
    QtCbor::Element e2 = rhs.d->elements.at(rhs.i);
    int c = compareElementRecursive(lhs.d, e1, rhs.d, e2, Comparison::ForOrdering);
    return Qt::compareThreeWay(c, 0);
}